

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

CBlock * __thiscall
TestChain100Setup::CreateBlock
          (TestChain100Setup *this,
          vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *txns,
          CScript *scriptPubKey,Chainstate *chainstate)

{
  uint256 hash;
  bool bVar1;
  Params *pPVar2;
  undefined8 in_RDX;
  ChainstateManager *in_RDI;
  long in_FS_OFFSET;
  BlockAssembler *unaff_retaddr;
  CMutableTransaction *tx;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *__range1;
  CBlock *block;
  const_iterator __end1;
  const_iterator __begin1;
  Options options;
  ChainstateManager *in_stack_fffffffffffffde8;
  CBlock *in_stack_fffffffffffffdf0;
  CBlock *in_stack_fffffffffffffdf8;
  CBlockHeader *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 uVar3;
  undefined8 in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *in_stack_fffffffffffffe28;
  ChainstateManager *block_00;
  undefined1 *puVar4;
  undefined1 *puVar5;
  reference in_stack_fffffffffffffe60;
  CTxMemPool *in_stack_fffffffffffffe68;
  Chainstate *in_stack_fffffffffffffe70;
  BlockAssembler *in_stack_fffffffffffffe78;
  undefined1 local_120 [200];
  undefined1 local_58 [48];
  ChainstateManager *local_28;
  CScript *scriptPubKeyIn;
  
  scriptPubKeyIn = *(CScript **)(in_FS_OFFSET + 0x28);
  puVar4 = local_58;
  block_00 = in_RDI;
  ::node::BlockAssembler::Options::Options((Options *)in_stack_fffffffffffffde8);
  puVar5 = local_120;
  ::node::BlockAssembler::BlockAssembler
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (Options *)in_stack_fffffffffffffe60);
  ::node::BlockAssembler::CreateNewBlock(unaff_retaddr,scriptPubKeyIn);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::operator->
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             in_stack_fffffffffffffde8);
  CBlock::CBlock(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             in_stack_fffffffffffffdf8);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_fffffffffffffde8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_fffffffffffffde8);
  inline_assertion_check<true,bool>
            ((bool *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (char *)in_stack_fffffffffffffe08);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::begin
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffdf0);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::end
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffdf0);
  while (bVar1 = __gnu_cxx::
                 operator==<const_CMutableTransaction_*,_std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>_>
                           ((__normal_iterator<const_CMutableTransaction_*,_std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>_>
                             *)in_stack_fffffffffffffdf8,
                            (__normal_iterator<const_CMutableTransaction_*,_std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>_>
                             *)in_stack_fffffffffffffdf0), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_fffffffffffffe60 =
         __gnu_cxx::
         __normal_iterator<const_CMutableTransaction_*,_std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>_>
         ::operator*((__normal_iterator<const_CMutableTransaction_*,_std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>_>
                      *)in_stack_fffffffffffffde8);
    MakeTransactionRef<CMutableTransaction_const&>((CMutableTransaction *)in_stack_fffffffffffffdf0)
    ;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_fffffffffffffde8,(value_type *)0xea95d3);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffde8);
    __gnu_cxx::
    __normal_iterator<const_CMutableTransaction_*,_std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>_>
    ::operator++((__normal_iterator<const_CMutableTransaction_*,_std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>_>
                  *)in_stack_fffffffffffffde8);
  }
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (char *)in_stack_fffffffffffffe08);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffdf8);
  ::node::RegenerateCommitments((CBlock *)block_00,in_RDI);
  while( true ) {
    CBlockHeader::GetHash(in_stack_fffffffffffffe08);
    uVar3 = *(undefined4 *)
             &(in_RDI->m_warningcache)._M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_fffffffffffffde8);
    pPVar2 = ChainstateManager::GetConsensus(in_stack_fffffffffffffde8);
    hash.super_base_blob<256U>.m_data._M_elems._8_8_ = puVar5;
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar4;
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_fffffffffffffe60;
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_RDX;
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)in_RDX >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)in_RDX >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)in_RDX >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)in_RDX >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)in_RDX >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)in_RDX >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)in_RDX >> 0x38);
    in_stack_fffffffffffffde8 = local_28;
    bVar1 = CheckProofOfWork(hash,(uint)((ulong)pPVar2 >> 0x20),
                             (Params *)CONCAT44(uVar3,in_stack_fffffffffffffe10));
    in_stack_fffffffffffffe10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe10);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    *(int *)((long)&(in_RDI->m_warningcache)._M_elems[0]._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left + 4) =
         *(int *)((long)&(in_RDI->m_warningcache)._M_elems[0]._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_left + 4) + 1;
  }
  if (*(CScript **)(in_FS_OFFSET + 0x28) != scriptPubKeyIn) {
    __stack_chk_fail();
  }
  return (CBlock *)block_00;
}

Assistant:

CBlock TestChain100Setup::CreateBlock(
    const std::vector<CMutableTransaction>& txns,
    const CScript& scriptPubKey,
    Chainstate& chainstate)
{
    BlockAssembler::Options options;
    CBlock block = BlockAssembler{chainstate, nullptr, options}.CreateNewBlock(scriptPubKey)->block;

    Assert(block.vtx.size() == 1);
    for (const CMutableTransaction& tx : txns) {
        block.vtx.push_back(MakeTransactionRef(tx));
    }
    RegenerateCommitments(block, *Assert(m_node.chainman));

    while (!CheckProofOfWork(block.GetHash(), block.nBits, m_node.chainman->GetConsensus())) ++block.nNonce;

    return block;
}